

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O1

void __thiscall
duckdb::FormatBytesFunction<1000l>
          (duckdb *this,DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  anon_union_16_2_67f50693_for_value *paVar1;
  long *plVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  pointer this_00;
  byte bVar5;
  undefined8 uVar6;
  pointer pLVar7;
  pointer pLVar8;
  reference vector;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  idx_t iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *dataptr;
  ExpressionState *extraout_RDX;
  ExpressionState *extraout_RDX_00;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> _Var12;
  ExpressionState *extraout_RDX_01;
  idx_t idx;
  unsigned_long uVar13;
  pointer puVar14;
  ulong uVar15;
  pointer puVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  idx_t iVar18;
  string_t sVar19;
  anon_struct_16_3_d7536bce_for_pointer aVar20;
  undefined1 local_c0 [24];
  pointer local_a8;
  pointer pLStack_a0;
  reference local_98;
  pointer local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  pointer local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this,0);
  count = *(idx_t *)(this + 0x18);
  local_c0._0_8_ = state;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType((Vector *)state,FLAT_VECTOR);
    puVar16 = (state->child_states).
              super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0._8_8_ = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector((Vector *)state);
    puVar14 = (pointer)(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar14 == (pointer)0x0) {
      if (count != 0) {
        puVar16 = puVar16 + 1;
        iVar18 = 0;
        _Var12._M_head_impl = extraout_RDX;
        do {
          sVar19 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             ((long)(((element_type *)(local_c0._8_8_ + iVar18 * 8))->owned_data).
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                    .super__Head_base<0UL,_unsigned_long_*,_false>,
                              (ValidityMask *)local_c0,(idx_t)_Var12._M_head_impl,result);
          _Var12._M_head_impl = sVar19.value._8_8_;
          puVar16[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar19.value._0_8_
          ;
          (puVar16->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
               _Var12._M_head_impl;
          iVar18 = iVar18 + 1;
          puVar16 = puVar16 + 2;
        } while (count != iVar18);
      }
    }
    else {
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar14;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)&state->types,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        local_c0._16_8_ = count + 0x3f >> 6;
        puVar16 = puVar16 + 1;
        dataptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Var12._M_head_impl = extraout_RDX_00;
        uVar17 = 0;
        local_98 = vector;
        local_90 = puVar16;
        do {
          uVar6 = local_c0._8_8_;
          puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = 0xffffffffffffffff;
          }
          else {
            uVar13 = puVar3[(long)dataptr];
          }
          uVar9 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar9 = count;
          }
          uVar15 = uVar9;
          local_88 = dataptr;
          if (uVar13 != 0) {
            uVar15 = uVar17;
            if (uVar13 == 0xffffffffffffffff) {
              if (uVar17 < uVar9) {
                puVar14 = puVar16 + uVar17 * 2;
                do {
                  sVar19 = UnaryLambdaWrapper::
                           Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                     ((long)(((element_type *)(uVar6 + uVar15 * 8))->owned_data).
                                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                            ._M_t.
                                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>,
                                      (ValidityMask *)local_c0,(idx_t)_Var12._M_head_impl,dataptr);
                  _Var12._M_head_impl = sVar19.value._8_8_;
                  puVar14[-1].
                  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                  .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                       sVar19.value._0_8_;
                  (puVar14->
                  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                  .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                       _Var12._M_head_impl;
                  uVar15 = uVar15 + 1;
                  puVar14 = puVar14 + 2;
                } while (uVar9 != uVar15);
              }
            }
            else if (uVar17 < uVar9) {
              puVar16 = puVar16 + uVar17 * 2;
              uVar15 = 0;
              do {
                if ((uVar13 >> (uVar15 & 0x3f) & 1) != 0) {
                  sVar19 = UnaryLambdaWrapper::
                           Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                     ((long)(((element_type *)(uVar6 + (uVar17 + uVar15) * 8))->
                                            owned_data).
                                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                            ._M_t.
                                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>,
                                      (ValidityMask *)local_c0,(idx_t)_Var12._M_head_impl,dataptr);
                  _Var12._M_head_impl = sVar19.value._8_8_;
                  puVar16[-1].
                  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                  .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                       sVar19.value._0_8_;
                  (puVar16->
                  super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                  .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
                       _Var12._M_head_impl;
                }
                uVar15 = uVar15 + 1;
                puVar16 = puVar16 + 2;
              } while ((uVar17 - uVar9) + uVar15 != 0);
              uVar15 = uVar17 + uVar15;
              vector = local_98;
              puVar16 = local_90;
            }
          }
          dataptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&local_88->_vptr__Sp_counted_base + 1);
          uVar17 = uVar15;
        } while (dataptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._16_8_);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType((Vector *)state,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)
             (state->child_states).
             super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar2 = (long *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull((Vector *)state,true);
      return;
    }
    ConstantVector::SetNull((Vector *)state,false);
    aVar20 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                       (*plVar2,(ValidityMask *)local_c0,idx,result);
    paVar1->pointer = aVar20;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType((Vector *)state,FLAT_VECTOR);
    puVar16 = (state->child_states).
              super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    FlatVector::VerifyFlatVector((Vector *)state);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        puVar16 = puVar16 + 1;
        iVar18 = 0;
        _Var12._M_head_impl = extraout_RDX_01;
        do {
          iVar11 = iVar18;
          if (psVar4 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar4[iVar18];
          }
          sVar19 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_78.data + iVar11 * 8),(ValidityMask *)local_c0,
                              (idx_t)_Var12._M_head_impl,result);
          _Var12._M_head_impl = sVar19.value._8_8_;
          puVar16[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar19.value._0_8_
          ;
          (puVar16->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
               _Var12._M_head_impl;
          iVar18 = iVar18 + 1;
          puVar16 = puVar16 + 2;
        } while (count != iVar18);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      puVar16 = puVar16 + 1;
      uVar17 = 0;
      do {
        uVar9 = uVar17;
        if (psVar4 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar4[uVar17];
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
          if ((state->child_states).
              super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            local_80 = (state->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_80);
            pLVar8 = pLStack_a0;
            pLVar7 = local_a8;
            local_a8 = (pointer)0x0;
            pLStack_a0 = (pointer)0x0;
            this_00 = (state->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start = pLVar7;
            (state->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = pLVar8;
            if (this_00 != (pointer)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            if (pLStack_a0 != (pointer)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_a0);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 &state->types);
            (state->child_states).
            super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pTVar10->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar17 & 0x3f;
          puVar14 = (state->child_states).
                    super_vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + (uVar17 >> 6);
          (puVar14->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
               (puVar14->
               super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
               .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          sVar19 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1000l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_78.data + uVar9 * 8),(ValidityMask *)local_c0,
                              uVar9 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[uVar9 >> 6]);
          puVar16[-1].
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar19.value._0_8_
          ;
          (puVar16->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl = sVar19.value._8_8_
          ;
        }
        uVar17 = uVar17 + 1;
        puVar16 = puVar16 + 2;
      } while (count != uVar17);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}